

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(char *str_id)

{
  ImGuiID local_24;
  ImGuiWindow *pIStack_20;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *str_id_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_20 = GImGui->CurrentWindow;
  g = (ImGuiContext *)str_id;
  local_24 = ImGuiWindow::GetIDNoKeepAlive(pIStack_20,str_id,(char *)0x0);
  ImVector<unsigned_int>::push_back(&pIStack_20->IDStack,&local_24);
  return;
}

Assistant:

void ImGui::PushID(const char* str_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(str_id);
    window->IDStack.push_back(id);
}